

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

void __thiscall
spvtools::opt::VectorDCE::MarkExtractUseAsLive
          (VectorDCE *this,Instruction *current_inst,BitVector *live_elements,
          LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *this_00;
  DefUseManager *this_01;
  WorkListItem local_90;
  uint32_t local_70;
  uint32_t local_6c;
  uint32_t item_size;
  uint32_t element_index;
  WorkListItem new_item;
  Instruction *operand_inst;
  uint32_t operand_id;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  *work_list_local;
  LiveComponentMap *live_components_local;
  BitVector *live_elements_local;
  Instruction *current_inst_local;
  VectorDCE *this_local;
  
  this_00 = Pass::context((Pass *)this);
  this_01 = IRContext::get_def_use_mgr(this_00);
  uVar2 = Instruction::GetSingleWordInOperand(current_inst,0);
  new_item.components.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)analysis::DefUseManager::GetDef(this_01,uVar2);
  bVar1 = HasVectorOrScalarResult
                    (this,(Instruction *)
                          new_item.components.bits_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    WorkListItem::WorkListItem((WorkListItem *)&item_size);
    _item_size = (Instruction *)
                 new_item.components.bits_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    uVar2 = Instruction::NumInOperands(current_inst);
    if (uVar2 < 2) {
      utils::BitVector::operator=((BitVector *)&new_item,live_elements);
    }
    else {
      local_6c = Instruction::GetSingleWordInOperand(current_inst,1);
      uVar2 = Instruction::type_id
                        ((Instruction *)
                         new_item.components.bits_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      local_70 = GetVectorComponentCount(this,uVar2);
      if (local_6c < local_70) {
        utils::BitVector::Set((BitVector *)&new_item,local_6c);
      }
    }
    WorkListItem::WorkListItem(&local_90,(WorkListItem *)&item_size);
    AddItemToWorkListIfNeeded(this,&local_90,live_components,work_list);
    WorkListItem::~WorkListItem(&local_90);
    WorkListItem::~WorkListItem((WorkListItem *)&item_size);
  }
  return;
}

Assistant:

void VectorDCE::MarkExtractUseAsLive(const Instruction* current_inst,
                                     const utils::BitVector& live_elements,
                                     LiveComponentMap* live_components,
                                     std::vector<WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t operand_id =
      current_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
  Instruction* operand_inst = def_use_mgr->GetDef(operand_id);

  if (HasVectorOrScalarResult(operand_inst)) {
    WorkListItem new_item;
    new_item.instruction = operand_inst;
    if (current_inst->NumInOperands() < 2) {
      new_item.components = live_elements;
    } else {
      uint32_t element_index = current_inst->GetSingleWordInOperand(1);
      uint32_t item_size = GetVectorComponentCount(operand_inst->type_id());
      if (element_index < item_size) {
        new_item.components.Set(element_index);
      }
    }
    AddItemToWorkListIfNeeded(new_item, live_components, work_list);
  }
}